

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::generateExecBufferIo
               (ostream *src,ShaderSpec *spec,char *invocationNdxName)

{
  bool bVar1;
  pointer pSVar2;
  istream *piVar3;
  ostream *poVar4;
  pointer pSVar5;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_280;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_278;
  const_iterator symIter_2;
  string line;
  istringstream opSrc;
  DeclareVariable local_d0;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_90;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_88;
  const_iterator symIter_1;
  DeclareVariable local_70;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_30;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_28;
  const_iterator symIter;
  char *invocationNdxName_local;
  ShaderSpec *spec_local;
  ostream *src_local;
  
  symIter._M_current = (Symbol *)invocationNdxName;
  local_28._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&spec->inputs);
  while( true ) {
    local_30._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&spec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    poVar4 = std::operator<<(src,"\t");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_28);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_28);
    glu::declare(&local_70,&pSVar5->varType,&pSVar2->name,0);
    poVar4 = glu::decl::operator<<(poVar4,&local_70);
    poVar4 = std::operator<<(poVar4," = inputs[");
    poVar4 = std::operator<<(poVar4,(char *)symIter._M_current);
    poVar4 = std::operator<<(poVar4,"].");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_28);
    poVar4 = std::operator<<(poVar4,(string *)pSVar5);
    std::operator<<(poVar4,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_70);
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_28);
  }
  local_88._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&spec->outputs);
  while( true ) {
    local_90._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&spec->outputs);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    poVar4 = std::operator<<(src,"\t");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_88);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_88);
    glu::declare(&local_d0,&pSVar5->varType,&pSVar2->name,0);
    poVar4 = glu::decl::operator<<(poVar4,&local_d0);
    std::operator<<(poVar4,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_d0);
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_88);
  }
  std::operator<<(src,"\n");
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)&spec->source,_S_in);
  std::__cxx11::string::string((string *)&symIter_2);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),(string *)&symIter_2);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    poVar4 = std::operator<<(src,"\t");
    poVar4 = std::operator<<(poVar4,(string *)&symIter_2);
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)&symIter_2);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  std::operator<<(src,"\n");
  local_278._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&spec->outputs);
  while( true ) {
    local_280._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&spec->outputs);
    bVar1 = __gnu_cxx::operator!=(&local_278,&local_280);
    if (!bVar1) break;
    poVar4 = std::operator<<(src,"\toutputs[");
    poVar4 = std::operator<<(poVar4,(char *)symIter._M_current);
    poVar4 = std::operator<<(poVar4,"].");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_278);
    poVar4 = std::operator<<(poVar4,(string *)pSVar5);
    poVar4 = std::operator<<(poVar4," = ");
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_278);
    poVar4 = std::operator<<(poVar4,(string *)pSVar5);
    std::operator<<(poVar4,";\n");
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_278);
  }
  return;
}

Assistant:

void BufferIoExecutor::generateExecBufferIo (std::ostream& src, const ShaderSpec& spec, const char* invocationNdxName)
{
	for (vector<Symbol>::const_iterator symIter = spec.inputs.begin(); symIter != spec.inputs.end(); ++symIter)
		src << "\t" << glu::declare(symIter->varType, symIter->name) << " = inputs[" << invocationNdxName << "]." << symIter->name << ";\n";

	for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
		src << "\t" << glu::declare(symIter->varType, symIter->name) << ";\n";

	src << "\n";

	{
		std::istringstream	opSrc	(spec.source);
		std::string			line;

		while (std::getline(opSrc, line))
			src << "\t" << line << "\n";
	}

	src << "\n";
	for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
		src << "\toutputs[" << invocationNdxName << "]." << symIter->name << " = " << symIter->name << ";\n";
}